

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

bool __thiscall
duckdb::ART::SearchLess
          (ART *this,ARTKey *upper_bound,bool equal,idx_t max_count,unsafe_vector<row_t> *row_ids)

{
  bool bVar1;
  bool bVar2;
  Iterator it;
  Iterator local_b8;
  
  bVar2 = true;
  if (*(char *)((long)&(this->tree).super_IndexPointer.data + 7) != '\0') {
    Iterator::Iterator(&local_b8,this);
    Iterator::FindMinimum(&local_b8,&this->tree);
    bVar1 = IteratorKey::GreaterThan(&local_b8.current_key,upper_bound,equal,local_b8.nested_depth);
    bVar2 = true;
    if (!bVar1) {
      bVar2 = Iterator::Scan(&local_b8,upper_bound,max_count,row_ids,equal);
    }
    ::std::_Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>::~_Deque_base
              ((_Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_> *)
               &local_b8.nodes);
    if (local_b8.current_key.key_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.current_key.key_bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return bVar2;
}

Assistant:

bool ART::SearchLess(ARTKey &upper_bound, bool equal, idx_t max_count, unsafe_vector<row_t> &row_ids) {
	if (!tree.HasMetadata()) {
		return true;
	}

	// Find the minimum value in the ART: we start scanning from this value.
	Iterator it(*this);
	it.FindMinimum(tree);

	// Early-out, if the minimum value is higher than the upper bound.
	if (it.current_key.GreaterThan(upper_bound, equal, it.GetNestedDepth())) {
		return true;
	}

	// Continue the scan until we reach the upper bound.
	return it.Scan(upper_bound, max_count, row_ids, equal);
}